

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

longlong __thiscall std::pmr::test_resource::status(test_resource *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  longlong lVar6;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock_);
  if (iVar2 == 0) {
    lVar5 = (this->m_bounds_errors_).super___atomic_base<long_long>._M_i +
            (this->m_mismatches_).super___atomic_base<long_long>._M_i;
    lVar1 = (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i;
    lVar3 = lVar1 + lVar5;
    if (lVar3 == 0 || SCARRY8(lVar1,lVar5) != lVar3 < 0) {
      if (((this->m_blocks_in_use_).super___atomic_base<long_long>._M_i < 1) &&
         ((long)(this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i < 1)) {
        lVar6 = 0;
      }
      else {
        lVar6 = -1;
      }
    }
    else {
      lVar6 = (longlong)(int)lVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
    return lVar6;
  }
  uVar4 = std::__throw_system_error(iVar2);
  __clang_call_terminate(uVar4);
}

Assistant:

long long test_resource::status() const noexcept
{
    static const int memoryLeak = -1;
    static const int success = 0;

    lock_guard guard{ m_lock_ };

    const long long numErrors = mismatches() + bounds_errors() +
                                bad_deallocate_params();

    if (numErrors > 0) {
        return static_cast<int>(numErrors);                           // RETURN
    }
    else if (has_allocations()) {
        return memoryLeak;                                            // RETURN
    }
    else {
        return success;                                               // RETURN
    }
}